

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::
Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
::eraseImpl(Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
            *this,size_t pos)

{
  Entry *pEVar1;
  size_t sVar2;
  Entry *pEVar3;
  size_t back;
  size_t pos_local;
  Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
  *this_local;
  
  pEVar1 = Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::operator[]
                     (&this->rows,pos);
  Impl<0UL,_false>::erase(this,pos,pEVar1);
  sVar2 = Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::size(&this->rows);
  sVar2 = sVar2 - 1;
  if (pos != sVar2) {
    pEVar1 = Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::operator[]
                       (&this->rows,sVar2);
    Impl<0UL,_false>::move(this,sVar2,pos,pEVar1);
    pEVar1 = Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::operator[]
                       (&this->rows,sVar2);
    pEVar1 = mv<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry>(pEVar1);
    pEVar3 = Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::operator[]
                       (&this->rows,pos);
    pEVar3->key = pEVar1->key;
    (pEVar3->value).super_Schema.raw = (pEVar1->value).super_Schema.raw;
  }
  Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::removeLast(&this->rows);
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}